

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O0

FT_String * tt_name_ascii_from_other(TT_Name entry,FT_Memory memory)

{
  int local_44;
  byte *pbStack_40;
  FT_Error error;
  FT_Byte *read;
  byte local_30;
  FT_UInt n;
  FT_UInt code;
  FT_UInt len;
  FT_String *string;
  FT_Memory memory_local;
  TT_Name entry_local;
  
  _code = 0;
  pbStack_40 = entry->string;
  n = (FT_UInt)entry->stringLength;
  string = (FT_String *)memory;
  memory_local = (FT_Memory)entry;
  entry_local = (TT_Name)ft_mem_qrealloc(memory,1,0,(ulong)(n + 1),(void *)0x0,&local_44);
  if (local_44 == 0) {
    for (read._4_4_ = 0; read._4_4_ < n; read._4_4_ = read._4_4_ + 1) {
      local_30 = *pbStack_40;
      if (local_30 == 0) break;
      if ((local_30 < 0x20) || (0x7f < local_30)) {
        local_30 = 0x3f;
      }
      *(byte *)((long)&entry_local->platformID + (ulong)read._4_4_) = local_30;
      pbStack_40 = pbStack_40 + 1;
    }
    *(undefined1 *)((long)&entry_local->platformID + (ulong)read._4_4_) = 0;
  }
  else {
    entry_local = (TT_Name)0x0;
  }
  return (FT_String *)entry_local;
}

Assistant:

static FT_String*
  tt_name_ascii_from_other( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength;

    if ( FT_QNEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = *read++;

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }